

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O3

void __thiscall basist::basisu_transcoder_state::clear(basisu_transcoder_state *this)

{
  undefined8 *puVar1;
  block_preds *__ptr;
  void *__ptr_00;
  bool bVar2;
  bool bVar3;
  vector<basist::basisu_transcoder_state::block_preds> *pvVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    __ptr = this->m_block_endpoint_preds[lVar6].m_p;
    if (__ptr != (block_preds *)0x0) {
      pvVar4 = this->m_block_endpoint_preds + lVar6;
      free(__ptr);
      pvVar4->m_p = (block_preds *)0x0;
      pvVar4->m_size = 0;
      pvVar4->m_capacity = 0;
    }
    lVar5 = 0;
    do {
      __ptr_00 = *(void **)((long)&this->m_prev_frame_indices[lVar6][0].m_p + lVar5);
      if (__ptr_00 != (void *)0x0) {
        puVar1 = (undefined8 *)((long)&this->m_prev_frame_indices[lVar6][0].m_p + lVar5);
        free(__ptr_00);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x100);
    lVar6 = 1;
    bVar2 = false;
  } while (bVar3);
  return;
}

Assistant:

void clear()
		{
			for (uint32_t i = 0; i < 2; i++)
			{
				m_block_endpoint_preds[i].clear();

				for (uint32_t j = 0; j < cMaxPrevFrameLevels; j++)
					m_prev_frame_indices[i][j].clear();
			}
		}